

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void printComponent(ComponentPtr *component,size_t c,string *indent,bool includeMaths)

{
  _Alloc_hider _Var1;
  string *__lhs;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  string con;
  ComponentPtr child;
  VariablePtr ev;
  ComponentPtr ev_parent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined4 local_84;
  string *local_80;
  long local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  ulong local_68;
  string local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58 [3];
  shared_ptr<libcellml::ParentedEntity> local_40;
  
  local_84 = (undefined4)CONCAT71(in_register_00000009,includeMaths);
  if (c == 0xffffffffffffffff) {
    poVar3 = std::operator<<((ostream *)&std::cout,"COMPONENT: \'");
    libcellml::NamedEntity::name_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&local_c8);
    std::operator<<(poVar3,"\'");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"]: ");
    libcellml::NamedEntity::name_abi_cxx11_();
    std::operator<<(poVar3,(string *)&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  libcellml::Entity::id_abi_cxx11_();
  bVar2 = std::operator!=(&local_c8,"");
  std::__cxx11::string::~string((string *)&local_c8);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,", id: ");
    libcellml::Entity::id_abi_cxx11_();
    std::operator<<(poVar3,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_80 = indent;
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
  poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"VARIABLES: ");
  libcellml::Component::variableCount();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," variables");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_68 = 0;
  while( true ) {
    uVar6 = local_68;
    uVar4 = libcellml::Component::variableCount();
    __lhs = local_80;
    if (uVar4 <= uVar6) break;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_80);
    poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    local_68 = uVar6 + 1;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"]: ");
    libcellml::Component::variable((ulong)&local_a8);
    libcellml::NamedEntity::name_abi_cxx11_();
    std::operator<<(poVar3,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    libcellml::Component::variable((ulong)&local_a8);
    libcellml::Variable::units();
    _Var1._M_p = local_c8._M_dataplus._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    if (_Var1._M_p != (pointer)0x0) {
      poVar3 = std::operator<<((ostream *)&std::cout," [");
      libcellml::Component::variable((ulong)local_60);
      libcellml::Variable::units();
      libcellml::NamedEntity::name_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,(string *)&local_c8);
      std::operator<<(poVar3,"]");
      std::__cxx11::string::~string((string *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
    }
    libcellml::Component::variable((ulong)&local_a8);
    libcellml::Variable::initialValue_abi_cxx11_();
    bVar2 = std::operator!=(&local_c8,"");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,", initial = ");
      libcellml::Component::variable((ulong)&local_a8);
      libcellml::Variable::initialValue_abi_cxx11_();
      std::operator<<(poVar3,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    libcellml::Component::variable((ulong)&local_c8);
    lVar5 = libcellml::Variable::equivalentVariableCount();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
    if (lVar5 != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_80);
      poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
      std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,anon_var_dwarf_aaeb,(allocator<char> *)&local_a8);
      uVar6 = 0;
      while( true ) {
        libcellml::Component::variable((ulong)&local_a8);
        uVar4 = libcellml::Variable::equivalentVariableCount();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
        if (uVar4 <= uVar6) break;
        libcellml::Component::variable((ulong)&local_a8);
        libcellml::Variable::equivalentVariable((ulong)&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
        if (local_78 == 0) {
          std::operator<<((ostream *)&std::cout,"WHOOPS! Null equivalent variable!");
        }
        else {
          libcellml::ParentedEntity::parent();
          std::dynamic_pointer_cast<libcellml::Component,libcellml::ParentedEntity>(&local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
          if (local_40.super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            std::operator<<((ostream *)&std::cout,
                            "WHOOPS! Null parent component for equivalent variable!");
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_c8);
            libcellml::NamedEntity::name_abi_cxx11_();
            poVar3 = std::operator<<(poVar3,(string *)&local_a8);
            poVar3 = std::operator<<(poVar3,":");
            libcellml::NamedEntity::name_abi_cxx11_();
            std::operator<<(poVar3,local_60);
            std::__cxx11::string::~string(local_60);
            std::__cxx11::string::~string((string *)&local_a8);
            libcellml::Variable::units();
            _Var1._M_p = local_a8._M_dataplus._M_p;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
            if (_Var1._M_p != (pointer)0x0) {
              poVar3 = std::operator<<((ostream *)&std::cout," [");
              libcellml::Variable::units();
              libcellml::NamedEntity::name_abi_cxx11_();
              poVar3 = std::operator<<(poVar3,(string *)&local_a8);
              std::operator<<(poVar3,"]");
              std::__cxx11::string::~string((string *)&local_a8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_58);
            }
            std::__cxx11::string::assign((char *)&local_c8);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_40.
                      super___shared_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
        uVar6 = uVar6 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  if ((char)local_84 != '\0') {
    libcellml::Component::math_abi_cxx11_();
    bVar2 = std::operator!=(&local_c8,"");
    std::__cxx11::string::~string((string *)&local_c8);
    if (bVar2) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
      poVar3 = std::operator<<(poVar3,"  Maths in the component is:");
      std::endl<char,std::char_traits<char>>(poVar3);
      libcellml::Component::math_abi_cxx11_();
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_c8);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  lVar5 = libcellml::ComponentEntity::componentCount();
  if (lVar5 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
    poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"CHILD COMPONENTS: ");
    libcellml::ComponentEntity::componentCount();
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," child components");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator+(&local_a8,__lhs,&FIXED_INDENT_abi_cxx11_);
    std::operator+(&local_c8,&local_a8,&FIXED_INDENT_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    uVar6 = 0;
    bVar2 = (bool)(char)local_84;
    while( true ) {
      uVar4 = libcellml::ComponentEntity::componentCount();
      if (uVar4 <= uVar6) break;
      libcellml::ComponentEntity::component((ulong)&local_a8);
      printComponent((ComponentPtr *)&local_a8,uVar6,&local_c8,bVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
      uVar6 = uVar6 + 1;
    }
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return;
}

Assistant:

void printComponent(const libcellml::ComponentPtr &component, size_t c, const std::string &indent, bool includeMaths)
{
    if (c == SIZE_MAX) {
        std::cout << "COMPONENT: '" << component->name() << "'";
    } else {
        std::cout << indent << "[" << c + 1 << "]: " << component->name();
    }

    if (component->id() != "") {
        std::cout << ", id: " << component->id();
    }

    std::cout << std::endl;
    std::cout << indent << FIXED_INDENT << "VARIABLES: " << component->variableCount() << " variables" << std::endl;

    // Printing the variables within the component.
    for (size_t v = 0; v < component->variableCount(); ++v) {
        std::cout << indent << FIXED_INDENT << FIXED_INDENT;
        std::cout << "[" << v + 1 << "]: " << component->variable(v)->name();
        if (component->variable(v)->units() != nullptr) {
            std::cout << " [" << component->variable(v)->units()->name() << "]";
        }
        if (component->variable(v)->initialValue() != "") {
            std::cout << ", initial = " << component->variable(v)->initialValue();
        }
        std::cout << std::endl;
        if (component->variable(v)->equivalentVariableCount() > 0) {
            std::cout << indent << FIXED_INDENT << FIXED_INDENT << FIXED_INDENT;
            std::string con = "  └──> ";
            for (size_t e = 0; e < component->variable(v)->equivalentVariableCount(); ++e) {
                auto ev = component->variable(v)->equivalentVariable(e);
                if (ev == nullptr) {
                    std::cout << "WHOOPS! Null equivalent variable!";
                    continue;
                }
                libcellml::ComponentPtr ev_parent = std::dynamic_pointer_cast<libcellml::Component>(ev->parent());
                if (ev_parent == nullptr) {
                    std::cout << "WHOOPS! Null parent component for equivalent variable!";
                    continue;
                }
                std::cout << con << ev_parent->name() << ":" << ev->name();
                if (ev->units() != nullptr) {
                    std::cout << " [" << ev->units()->name() << "]";
                }
                con = ", ";
            }
            std::cout << std::endl;
        }
    }

    // Print the maths within the component.
    if (includeMaths) {
        if (component->math() != "") {
            std::cout << indent << "  Maths in the component is:" << std::endl;
            std::cout << component->math() << std::endl;
        }
    }

    // Print the encapsulated components
    if (component->componentCount() > 0) {
        std::cout << indent << FIXED_INDENT << "CHILD COMPONENTS: " << component->componentCount()
                  << " child components" << std::endl;
        std::string newIndent = indent + FIXED_INDENT + FIXED_INDENT;

        for (size_t c2 = 0; c2 < component->componentCount(); ++c2) {
            auto child = component->component(c2);
            printComponent(child, c2, newIndent, includeMaths);
        }
    }
}